

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

undefined4 __thiscall
despot::RockSampleEastScenarioLowerBound::Value
          (RockSampleEastScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  BaseRockSample *this_00;
  int iVar1;
  uint uVar2;
  const_reference ppSVar3;
  double dVar4;
  double dVar5;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  RockSampleEastScenarioLowerBound *this_local;
  
  dVar4 = (double)despot::State::Weight((vector *)particles);
  iVar1 = Grid<int>::xsize(this->grid_);
  this_00 = this->rs_model_;
  ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[](particles,0);
  uVar2 = BaseRockSample::GetX(this_00,*ppSVar3);
  dVar5 = Globals::Discount(~uVar2 + iVar1);
  despot::ValuedAction::ValuedAction((ValuedAction *)&this_local,1,dVar4 * 10.0 * dVar5);
  return this_local._0_4_;
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		return ValuedAction(Compass::EAST,
			10 * State::Weight(particles)
				* Globals::Discount(grid_.xsize() - rs_model_->GetX(particles[0]) - 1));
	}